

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

void __thiscall ANN::initialize(ANN *this,double beg,double end)

{
  time_t tVar1;
  size_type sVar2;
  reference this_00;
  Matrix *this_01;
  uint local_24;
  uint i;
  double end_local;
  double beg_local;
  ANN *this_local;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<Layer,_std::allocator<Layer>_>::size(&this->m_layers);
    if (sVar2 - 1 <= (ulong)local_24) break;
    this_00 = std::vector<Layer,_std::allocator<Layer>_>::operator[]
                        (&this->m_layers,(ulong)local_24);
    this_01 = Layer::weights(this_00);
    Matrix::random_init(this_01,beg,end);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void ANN::initialize(double beg, double end){
    srand(time(0));
    for(uint i=0;i<m_layers.size()-1;++i){
        m_layers[i].weights().random_init(beg, end);
    }
}